

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minijson_reader.hpp
# Opt level: O1

utf8_char minijson::detail::utf16_to_utf8(uint16_t high,uint16_t low)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint8_t auVar4 [4];
  utf8_char uVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  
  if ((ushort)(high + 0x2000) < 0xf800) {
    if (low != 0) goto LAB_001074a0;
    uVar1 = (uint)high;
  }
  else {
    if ((0xdbff < high) || ((ushort)(low + 0x2000) < 0xfc00)) goto LAB_001074a0;
    uVar1 = (uint)(ushort)(high + 0x2800) * 0x400 + (int)(short)low + 0x12400;
  }
  uVar7 = 0;
  if (uVar1 < 0x80) {
    uVar3 = 0;
    uVar2 = 0;
    uVar8 = uVar1;
  }
  else if (uVar1 < 0x800) {
    uVar8 = uVar1 >> 6 | 0xc0;
    uVar2 = uVar1 & 0x3f | 0x80;
    uVar3 = 0;
  }
  else if (uVar1 < 0x10000) {
    uVar8 = uVar1 >> 0xc | 0xe0;
    uVar2 = uVar1 >> 6 & 0x3f | 0x80;
    uVar3 = uVar1 & 0x3f | 0x80;
  }
  else {
    if (0x1fffff < uVar1) {
LAB_001074a0:
      uVar6 = __cxa_allocate_exception(1);
      __cxa_throw(uVar6,&encoding_error::typeinfo,0);
    }
    uVar8 = uVar1 >> 0x12 | 0xf0;
    uVar2 = uVar1 >> 0xc & 0x3f | 0x80;
    uVar3 = uVar1 >> 6 & 0x3f | 0x80;
    uVar7 = (uVar1 & 0x3f) << 0x18 | 0x80000000;
  }
  auVar4 = (uint8_t  [4])(uVar8 & 0xff | uVar2 << 8 | uVar3 << 0x10 | uVar7);
  uVar5.bytes[0] = auVar4[0];
  uVar5.bytes[1] = auVar4[1];
  uVar5.bytes[2] = auVar4[2];
  uVar5.bytes[3] = auVar4[3];
  return (utf8_char)uVar5.bytes;
}

Assistant:

inline utf8_char utf16_to_utf8(uint16_t high, uint16_t low)
{
    return utf32_to_utf8(utf16_to_utf32(high, low));
}